

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor_tests.cpp
# Opt level: O3

void check_bson_cursor_document<jsoncons::bson::basic_bson_cursor<jsoncons::bytes_source,std::allocator<char>>>
               (string *info,
               basic_bson_cursor<jsoncons::bytes_source,_std::allocator<char>_> *cursor,
               string *expectedKey,int expectedValue)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  string *psVar8;
  Flags FVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t sVar12;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  bool bVar13;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage7;
  char local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  ITransientExpression local_240;
  string *local_230;
  char *local_228;
  size_type sStack_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  undefined1 local_210 [8];
  size_type sStack_208;
  MessageBuilder local_200;
  string *local_1a0;
  int local_194;
  StringRef local_190;
  StringRef local_180;
  StringRef local_170;
  StringRef local_160;
  StringRef local_150;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  ScopedMessage local_80;
  
  local_240._vptr_ITransientExpression = (_func_int **)0x7f98b8;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xac;
  local_194 = expectedValue;
  Catch::MessageBuilder::MessageBuilder
            (&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_200.super_MessageStream.m_stream.m_oss,(info->_M_dataplus)._M_p,
             info->_M_string_length);
  Catch::ScopedMessage::ScopedMessage(&local_80,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_info.message._M_dataplus._M_p != &local_200.m_info.message.field_2) {
    operator_delete(local_200.m_info.message._M_dataplus._M_p,
                    CONCAT53(local_200.m_info.message.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_200.m_info.message.field_2._M_local_buf[2],
                                      local_200.m_info.message.field_2._M_allocated_capacity._0_2_))
                    + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_200);
  local_240._vptr_ITransientExpression = (_func_int **)0x7f9638;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xae;
  Catch::StringRef::StringRef(&local_150,"cursor.done()");
  FVar9 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_150,FVar9);
  local_1a0 = expectedKey;
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_240._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_240._vptr_ITransientExpression._1_7_,(char)iVar10);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_200,(ExprLhs<bool> *)&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xaf;
  Catch::StringRef::StringRef
            (&local_90,"staj_event_type::begin_object == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_90,ContinueOnFailure);
  local_210[0] = 0xd;
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)CONCAT44(extraout_var,iVar10);
  cVar7 = local_210[0];
  local_261 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_260,"==");
  local_240.m_result = cVar7 == cVar1;
  local_240.m_isBinaryExpression = true;
  local_240._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b30448;
  local_228 = local_260._M_dataplus._M_p;
  sStack_220 = local_260._M_string_length;
  local_230 = (string *)local_210;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_261;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_200,&local_240);
  Catch::ITransientExpression::~ITransientExpression(&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xb0;
  Catch::StringRef::StringRef(&local_a0,"semantic_tag::none == cursor.current().tag()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_a0,ContinueOnFailure);
  auVar2[0xf] = 0;
  auVar2._0_15_ = stack0xfffffffffffffdf1;
  _local_210 = (basic_string_view<char,_std::char_traits<char>_>)(auVar2 << 8);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)(CONCAT44(extraout_var_00,iVar10) + 1);
  cVar7 = local_210[0];
  local_261 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_260,"==");
  local_240.m_result = cVar7 == cVar1;
  local_240.m_isBinaryExpression = true;
  local_240._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b30980;
  local_228 = local_260._M_dataplus._M_p;
  sStack_220 = local_260._M_string_length;
  local_230 = (string *)local_210;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_261;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_200,&local_240);
  Catch::ITransientExpression::~ITransientExpression(&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f9638;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xb2;
  Catch::StringRef::StringRef(&local_160,"cursor.done()");
  FVar9 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_160,FVar9);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_240._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_240._vptr_ITransientExpression._1_7_,(char)iVar10);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_200,(ExprLhs<bool> *)&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xb4;
  Catch::StringRef::StringRef(&local_b0,"staj_event_type::key == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_b0,ContinueOnFailure);
  auVar3[0xf] = 0;
  auVar3._0_15_ = stack0xfffffffffffffdf1;
  _local_210 = (basic_string_view<char,_std::char_traits<char>_>)(auVar3 << 8);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)CONCAT44(extraout_var_01,iVar10);
  cVar7 = local_210[0];
  local_261 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_260,"==");
  local_240.m_result = cVar7 == cVar1;
  local_240.m_isBinaryExpression = true;
  local_240._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b30448;
  local_228 = local_260._M_dataplus._M_p;
  sStack_220 = local_260._M_string_length;
  local_230 = (string *)local_210;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_261;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_200,&local_240);
  Catch::ITransientExpression::~ITransientExpression(&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xb5;
  Catch::StringRef::StringRef(&local_c0,"semantic_tag::none == cursor.current().tag()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_c0,ContinueOnFailure);
  auVar4[0xf] = 0;
  auVar4._0_15_ = stack0xfffffffffffffdf1;
  _local_210 = (basic_string_view<char,_std::char_traits<char>_>)(auVar4 << 8);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)(CONCAT44(extraout_var_02,iVar10) + 1);
  cVar7 = local_210[0];
  local_261 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_260,"==");
  local_240.m_result = cVar7 == cVar1;
  local_240.m_isBinaryExpression = true;
  local_240._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b30980;
  local_228 = local_260._M_dataplus._M_p;
  sStack_220 = local_260._M_string_length;
  local_230 = (string *)local_210;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_261;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_200,&local_240);
  Catch::ITransientExpression::~ITransientExpression(&local_240);
  psVar8 = local_1a0;
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xb6;
  Catch::StringRef::StringRef
            (&local_d0,"expectedKey == cursor.current().template get<std::string>()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_d0,ContinueOnFailure);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  jsoncons::basic_staj_event<char>::get<std::__cxx11::string>
            (&local_260,(basic_staj_event<char> *)CONCAT44(extraout_var_03,iVar10));
  sVar12 = psVar8->_M_string_length;
  if (sVar12 == local_260._M_string_length) {
    if (sVar12 == 0) {
      bVar13 = true;
    }
    else {
      iVar10 = bcmp((psVar8->_M_dataplus)._M_p,local_260._M_dataplus._M_p,sVar12);
      bVar13 = iVar10 == 0;
    }
  }
  else {
    bVar13 = false;
  }
  Catch::StringRef::StringRef((StringRef *)local_210,"==");
  local_240.m_result = bVar13;
  local_240.m_isBinaryExpression = true;
  local_240._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b309c0;
  local_230 = psVar8;
  local_228 = (char *)local_210;
  sStack_220 = sStack_208;
  local_218 = &local_260;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_200,&local_240);
  Catch::ITransientExpression::~ITransientExpression(&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xb7;
  Catch::StringRef::StringRef
            (&local_e0,"expectedKey == cursor.current().template get<jsoncons::string_view>()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_e0,ContinueOnFailure);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  _local_210 = jsoncons::basic_staj_event<char>::
               get<std::basic_string_view<char,std::char_traits<char>>>
                         ((basic_staj_event<char> *)CONCAT44(extraout_var_04,iVar10));
  sVar12 = local_210;
  if (psVar8->_M_string_length == sVar12) {
    if (sVar12 != 0) {
      iVar10 = bcmp((psVar8->_M_dataplus)._M_p,local_210._8_8_,sVar12);
      if (iVar10 != 0) goto LAB_002027b5;
    }
    bVar13 = true;
  }
  else {
LAB_002027b5:
    bVar13 = false;
  }
  Catch::StringRef::StringRef((StringRef *)&local_260,"==");
  local_240.m_result = bVar13;
  local_240.m_isBinaryExpression = true;
  local_240._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b308c0;
  local_230 = psVar8;
  local_228 = local_260._M_dataplus._M_p;
  sStack_220 = local_260._M_string_length;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_200,&local_240);
  Catch::ITransientExpression::~ITransientExpression(&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f9638;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xb9;
  Catch::StringRef::StringRef(&local_170,"cursor.done()");
  FVar9 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_170,FVar9);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_240._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_240._vptr_ITransientExpression._1_7_,(char)iVar10);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_200,(ExprLhs<bool> *)&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xbb;
  Catch::StringRef::StringRef
            (&local_f0,"staj_event_type::int64_value == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_f0,ContinueOnFailure);
  local_210[0] = 5;
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)CONCAT44(extraout_var_05,iVar10);
  cVar7 = local_210[0];
  local_261 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_260,"==");
  local_240.m_result = cVar7 == cVar1;
  local_240.m_isBinaryExpression = true;
  local_240._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b30448;
  local_228 = local_260._M_dataplus._M_p;
  sStack_220 = local_260._M_string_length;
  local_230 = (string *)local_210;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_261;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_200,&local_240);
  Catch::ITransientExpression::~ITransientExpression(&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xbc;
  Catch::StringRef::StringRef(&local_100,"semantic_tag::none == cursor.current().tag()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_100,ContinueOnFailure);
  auVar5[0xf] = 0;
  auVar5._0_15_ = stack0xfffffffffffffdf1;
  _local_210 = (basic_string_view<char,_std::char_traits<char>_>)(auVar5 << 8);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)(CONCAT44(extraout_var_06,iVar10) + 1);
  cVar7 = local_210[0];
  local_261 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_260,"==");
  local_240.m_result = cVar7 == cVar1;
  local_240.m_isBinaryExpression = true;
  local_240._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b30980;
  local_228 = local_260._M_dataplus._M_p;
  sStack_220 = local_260._M_string_length;
  local_230 = (string *)local_210;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_261;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_200,&local_240);
  Catch::ITransientExpression::~ITransientExpression(&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xbd;
  Catch::StringRef::StringRef(&local_110,"expectedValue == cursor.current().template get<int>()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_110,ContinueOnFailure);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  iVar11 = jsoncons::basic_staj_event<char>::get<int>
                     ((basic_staj_event<char> *)CONCAT44(extraout_var_07,iVar10));
  iVar10 = local_194;
  local_210._0_4_ = iVar11;
  Catch::StringRef::StringRef((StringRef *)&local_260,"==");
  local_240.m_result = iVar10 == iVar11;
  local_240.m_isBinaryExpression = true;
  local_240._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b30900;
  local_228 = local_260._M_dataplus._M_p;
  sStack_220 = local_260._M_string_length;
  local_230 = (string *)&local_194;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_200,&local_240);
  Catch::ITransientExpression::~ITransientExpression(&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f9638;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xbf;
  Catch::StringRef::StringRef(&local_180,"cursor.done()");
  FVar9 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_180,FVar9);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_240._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_240._vptr_ITransientExpression._1_7_,(char)iVar10);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_200,(ExprLhs<bool> *)&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xc1;
  Catch::StringRef::StringRef
            (&local_120,"staj_event_type::end_object == cursor.current().event_type()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_120,ContinueOnFailure);
  local_210[0] = 7;
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)CONCAT44(extraout_var_08,iVar10);
  cVar7 = local_210[0];
  local_261 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_260,"==");
  local_240.m_result = cVar7 == cVar1;
  local_240.m_isBinaryExpression = true;
  local_240._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b30448;
  local_228 = local_260._M_dataplus._M_p;
  sStack_220 = local_260._M_string_length;
  local_230 = (string *)local_210;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_261;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_200,&local_240);
  Catch::ITransientExpression::~ITransientExpression(&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xc2;
  Catch::StringRef::StringRef(&local_130,"semantic_tag::none == cursor.current().tag()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_130,ContinueOnFailure);
  auVar6[0xf] = 0;
  auVar6._0_15_ = stack0xfffffffffffffdf1;
  _local_210 = (basic_string_view<char,_std::char_traits<char>_>)(auVar6 << 8);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(cursor);
  cVar1 = *(char *)(CONCAT44(extraout_var_09,iVar10) + 1);
  cVar7 = local_210[0];
  local_261 = cVar1;
  Catch::StringRef::StringRef((StringRef *)&local_260,"==");
  local_240.m_result = cVar7 == cVar1;
  local_240.m_isBinaryExpression = true;
  local_240._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b30980;
  local_228 = local_260._M_dataplus._M_p;
  sStack_220 = local_260._M_string_length;
  local_230 = (string *)local_210;
  local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_261;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_200,&local_240);
  Catch::ITransientExpression::~ITransientExpression(&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  local_240._vptr_ITransientExpression = (_func_int **)0x7f966c;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 0xc5;
  Catch::StringRef::StringRef(&local_190,"cursor.done()");
  FVar9 = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_190,FVar9);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_240._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_240._vptr_ITransientExpression._1_7_,(char)iVar10);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_200,(ExprLhs<bool> *)&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[7])(cursor);
  local_240._vptr_ITransientExpression = (_func_int **)0x7f42b5;
  local_240.m_isBinaryExpression = true;
  local_240.m_result = false;
  local_240._10_6_ = 0;
  local_260._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_cursor_tests.cpp"
  ;
  local_260._M_string_length = 199;
  Catch::StringRef::StringRef(&local_140,"cursor.done()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_200,(StringRef *)&local_240,(SourceLineInfo *)&local_260,
             local_140,ContinueOnFailure);
  iVar10 = (*(cursor->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[3])(cursor);
  local_240._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_240._vptr_ITransientExpression._1_7_,(char)iVar10);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)&local_200,(ExprLhs<bool> *)&local_240);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_200);
  if (local_200.m_info.message.field_2._M_local_buf[2] == '\0') {
    (**(code **)(*(long *)local_200.m_info.message.field_2._8_8_ + 0x70))();
  }
  Catch::ScopedMessage::~ScopedMessage(&local_80);
  return;
}

Assistant:

void check_bson_cursor_document(std::string info, CursorType& cursor,
                                std::string expectedKey, int expectedValue)
{
    INFO(info);

    REQUIRE_FALSE(cursor.done());
    CHECK(staj_event_type::begin_object == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());

    REQUIRE_FALSE(cursor.done());
    cursor.next();
    CHECK(staj_event_type::key == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());
    CHECK(expectedKey == cursor.current().template get<std::string>());
    CHECK(expectedKey == cursor.current().template get<jsoncons::string_view>());

    REQUIRE_FALSE(cursor.done());
    cursor.next();
    CHECK(staj_event_type::int64_value == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());
    CHECK(expectedValue == cursor.current().template get<int>());

    REQUIRE_FALSE(cursor.done());
    cursor.next();
    CHECK(staj_event_type::end_object == cursor.current().event_type());
    CHECK(semantic_tag::none == cursor.current().tag());

    // Extra next() required to pop out of document state
    CHECK_FALSE(cursor.done());
    cursor.next();
    CHECK(cursor.done());
}